

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O2

int ipc_listener_set_perms(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  ulong in_RAX;
  undefined8 uStack_28;
  int mode;
  
  uStack_28 = in_RAX;
  iVar1 = nni_copyin_int((int *)((long)&uStack_28 + 4),buf,sz,0,0xf000,t);
  if ((iVar1 == 0) && (iVar1 = 0, *(short *)((long)arg + 0x88) != 5)) {
    if ((uStack_28 & 0xf00000000000) == 0) {
      uStack_28 = uStack_28 | 0xc00000000000;
      nni_mtx_lock((nni_mtx *)((long)arg + 0x140));
      if (*(char *)((long)arg + 0x128) == '\0') {
        *(undefined4 *)((long)arg + 0x138) = uStack_28._4_4_;
        iVar1 = 0;
      }
      else {
        iVar1 = 4;
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
    }
    else {
      iVar1 = 3;
    }
  }
  return iVar1;
}

Assistant:

static int
ipc_listener_set_perms(void *arg, const void *buf, size_t sz, nni_type t)
{
	ipc_listener *l = arg;
	int           mode;
	int           rv;

	if ((rv = nni_copyin_int(&mode, buf, sz, 0, S_IFMT, t)) != 0) {
		return (rv);
	}
	if (l->sa.s_family == NNG_AF_ABSTRACT) {
		// We ignore permissions on abstract sockets.
		// They succeed, but have no effect.
		return (0);
	}
	if ((mode & S_IFMT) != 0) {
		return (NNG_EINVAL);
	}
	mode |= S_IFSOCK; // set IFSOCK to ensure non-zero
	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_EBUSY);
	}
	l->perms = mode;
	nni_mtx_unlock(&l->mtx);
	return (0);
}